

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O1

void __thiscall Diligent::DescriptorSetAllocation::Release(DescriptorSetAllocation *this)

{
  char (*in_RCX) [55];
  string msg;
  string local_30;
  
  if (this->Set != (VkDescriptorSet)0x0) {
    if ((this->DescrSetAllocator == (DescriptorSetAllocator *)0x0) ||
       (this->Pool == (VkDescriptorPool)0x0)) {
      FormatString<char[26],char[55]>
                (&local_30,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DescrSetAllocator != nullptr && Pool != VK_NULL_HANDLE",in_RCX);
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"Release",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
                 ,0x27);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    DescriptorSetAllocator::FreeDescriptorSet
              (this->DescrSetAllocator,this->Set,this->Pool,this->CmdQueueMask);
    this->CmdQueueMask = 0;
    this->DescrSetAllocator = (DescriptorSetAllocator *)0x0;
    this->Set = (VkDescriptorSet)0x0;
    this->Pool = (VkDescriptorPool)0x0;
  }
  return;
}

Assistant:

void DescriptorSetAllocation::Release()
{
    if (Set != VK_NULL_HANDLE)
    {
        VERIFY_EXPR(DescrSetAllocator != nullptr && Pool != VK_NULL_HANDLE);
        DescrSetAllocator->FreeDescriptorSet(Set, Pool, CmdQueueMask);

        Reset();
    }
}